

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O1

void __thiscall
ft::deque<int,ft::allocator<int>>::assign<ft::constDequeIterator<int,64ul>>
          (deque<int,ft::allocator<int>> *this,constDequeIterator<int,_64UL> *first,
          constDequeIterator<int,_64UL> *last,type *param_3)

{
  pointer pvVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  pointer pvVar5;
  long lVar6;
  pointer pvVar7;
  map_pointer ppvVar8;
  
  deque<int,_ft::allocator<int>_>::clear((deque<int,_ft::allocator<int>_> *)this);
  pvVar7 = (first->super_dequeIterator<int,_64UL>).m_cur;
  ppvVar8 = (first->super_dequeIterator<int,_64UL>).m_node;
  lVar6 = (long)(last->super_dequeIterator<int,_64UL>).m_node - (long)ppvVar8;
  lVar2 = ((long)(first->super_dequeIterator<int,_64UL>).m_last - (long)pvVar7 >> 2) +
          ((long)(last->super_dequeIterator<int,_64UL>).m_cur -
           (long)(last->super_dequeIterator<int,_64UL>).m_first >> 2);
  lVar2 = ((lVar2 + lVar6 * 8) - (lVar2 + lVar6 * 8 + -0x40 >> 0x3f)) + -0x40 >> 1;
  uVar3 = ((long)pvVar7 - (long)(first->super_dequeIterator<int,_64UL>).m_first >> 2) + lVar2;
  if (uVar3 < 0x40) {
    pvVar5 = (first->super_dequeIterator<int,_64UL>).m_last;
    pvVar7 = pvVar7 + lVar2;
  }
  else {
    if ((long)uVar3 < 1) {
      uVar4 = ~uVar3 + 0x3f;
      if ((long)uVar3 < 0) {
        uVar4 = ~uVar3;
      }
      uVar4 = ~((long)uVar4 >> 6);
    }
    else {
      uVar4 = uVar3 >> 6;
    }
    ppvVar8 = ppvVar8 + uVar4;
    pvVar7 = *ppvVar8 + uVar3 + uVar4 * -0x40;
    pvVar5 = *ppvVar8 + 0x40;
  }
  while (pvVar1 = (last->super_dequeIterator<int,_64UL>).m_cur, pvVar7 != pvVar1) {
    deque<int,_ft::allocator<int>_>::push_back((deque<int,_ft::allocator<int>_> *)this,pvVar7);
    pvVar7 = pvVar7 + 1;
    if (pvVar7 == pvVar5) {
      pvVar7 = ppvVar8[1];
      ppvVar8 = ppvVar8 + 1;
      pvVar5 = pvVar7 + 0x40;
    }
  }
  pvVar7 = (first->super_dequeIterator<int,_64UL>).m_cur;
  pvVar5 = (first->super_dequeIterator<int,_64UL>).m_first;
  ppvVar8 = (first->super_dequeIterator<int,_64UL>).m_node;
  lVar6 = (long)(last->super_dequeIterator<int,_64UL>).m_node - (long)ppvVar8;
  lVar2 = ((long)(first->super_dequeIterator<int,_64UL>).m_last - (long)pvVar7 >> 2) +
          ((long)pvVar1 - (long)(last->super_dequeIterator<int,_64UL>).m_first >> 2);
  lVar2 = ((lVar2 + lVar6 * 8) - (lVar2 + lVar6 * 8 + -0x40 >> 0x3f)) + -0x40 >> 1;
  uVar3 = ((long)pvVar7 - (long)pvVar5 >> 2) + lVar2;
  if (uVar3 < 0x40) {
    pvVar7 = pvVar7 + lVar2;
  }
  else {
    if ((long)uVar3 < 1) {
      uVar4 = ~uVar3 + 0x3f;
      if ((long)uVar3 < 0) {
        uVar4 = ~uVar3;
      }
      uVar4 = ~((long)uVar4 >> 6);
    }
    else {
      uVar4 = uVar3 >> 6;
    }
    ppvVar8 = ppvVar8 + uVar4;
    pvVar5 = *ppvVar8;
    pvVar7 = pvVar5 + uVar3 + uVar4 * -0x40;
  }
  while (pvVar7 != (first->super_dequeIterator<int,_64UL>).m_cur) {
    if (pvVar7 == pvVar5) {
      pvVar5 = ppvVar8[-1];
      ppvVar8 = ppvVar8 + -1;
      pvVar7 = pvVar5 + 0x40;
    }
    pvVar7 = pvVar7 + -1;
    deque<int,_ft::allocator<int>_>::push_front((deque<int,_ft::allocator<int>_> *)this,pvVar7);
  }
  return;
}

Assistant:

void assign(Iterator first, Iterator last,
				typename ft::_void_t<typename ft::iterator_traits<Iterator>::iterator_category>::type * = 0) {
		this->clear();

		Iterator	middle = ft::next(first, ft::distance(first, last) / 2);
		while (middle != last) {
			this->push_back(*middle);
			++middle;
		}

		middle = ft::next(first, ft::distance(first, last) / 2);
		while (middle != first) {
			--middle;
			this->push_front(*middle);
		}
	}